

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_set_ret(void *el)

{
  XMLError XVar1;
  uint32_t local_2c;
  XMLError er;
  int ret;
  XMLElement *pEl;
  XMLElement **ppEl;
  void *el_local;
  
  if (el == (void *)0x0) {
    el_local._4_4_ = 2;
  }
  else {
    _er = *el;
    local_2c = 0;
    pEl = (XMLElement *)el;
    ppEl = (XMLElement **)el;
    XVar1 = tinyxml2::XMLElement::QueryIntAttribute(_er,"value",(int *)&local_2c);
    if (XVar1 == XML_NO_ERROR) {
      el_local._4_4_ = setret(local_2c);
    }
    else {
      el_local._4_4_ = 5;
    }
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_set_ret(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;
    int ret=0;
    XMLError er = pEl->QueryIntAttribute("value",&ret);
    if(er!=XML_NO_ERROR){
        return proc_xml_err;
    }

    return ivk::setret((uint32_t)ret);
}